

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O2

Vector<Converter::Impl::RawDeclarationVariable> * __thiscall
dxil_spv::Converter::Impl::create_bindless_heap_variable_alias_group
          (Vector<Converter::Impl::RawDeclarationVariable> *__return_storage_ptr__,Impl *this,
          BindlessInfo *base_info,Vector<RawDeclaration> *raw_decls)

{
  pointer pRVar1;
  ComponentType CVar2;
  RawDeclaration *decl;
  pointer pRVar3;
  value_type local_68;
  BindlessInfo info;
  
  (__return_storage_ptr__->
  super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
  ::reserve(__return_storage_ptr__,
            ((long)(raw_decls->
                   super__Vector_base<dxil_spv::Converter::Impl::RawDeclaration,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclaration>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
            (long)(raw_decls->
                  super__Vector_base<dxil_spv::Converter::Impl::RawDeclaration,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclaration>_>
                  )._M_impl.super__Vector_impl_data._M_start) / 0xc);
  pRVar1 = (raw_decls->
           super__Vector_base<dxil_spv::Converter::Impl::RawDeclaration,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclaration>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (pRVar3 = (raw_decls->
                super__Vector_base<dxil_spv::Converter::Impl::RawDeclaration,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclaration>_>
                )._M_impl.super__Vector_impl_data._M_start; pRVar3 != pRVar1; pRVar3 = pRVar3 + 1) {
    local_68.var_id = 0;
    local_68.declaration.type = pRVar3->type;
    local_68.declaration.width = pRVar3->width;
    local_68.declaration.vecsize = pRVar3->vecsize;
    info.binding = base_info->binding;
    info.type = base_info->type;
    info.component = base_info->component;
    info._2_2_ = *(undefined2 *)&base_info->field_0x2;
    info.raw_vecsize = base_info->raw_vecsize;
    info.kind = base_info->kind;
    info._9_3_ = *(undefined3 *)&base_info->field_0x9;
    info.format = base_info->format;
    info.descriptor_type = base_info->descriptor_type;
    info.uav_read = base_info->uav_read;
    info.uav_written = base_info->uav_written;
    info.uav_coherent = base_info->uav_coherent;
    info.counters = base_info->counters;
    info.offsets = base_info->offsets;
    info.aliased = base_info->aliased;
    info.relaxed_precision = base_info->relaxed_precision;
    info._27_1_ = base_info->field_0x1b;
    info.desc_set = base_info->desc_set;
    CVar2 = raw_width_to_component_type(pRVar3->type,pRVar3->width);
    info.component = CVar2;
    info.raw_vecsize = pRVar3->vecsize;
    local_68.var_id = create_bindless_heap_variable(this,&info);
    std::
    vector<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
    ::push_back(__return_storage_ptr__,&local_68);
  }
  return __return_storage_ptr__;
}

Assistant:

Vector<Converter::Impl::RawDeclarationVariable>
Converter::Impl::create_bindless_heap_variable_alias_group(const BindlessInfo &base_info,
                                                           const Vector<RawDeclaration> &raw_decls)
{
	Vector<RawDeclarationVariable> decls;
	decls.reserve(raw_decls.size());

	for (auto &decl : raw_decls)
	{
		RawDeclarationVariable var = {};
		var.declaration = decl;

		auto info = base_info;
		info.component = raw_width_to_component_type(decl.type, decl.width);
		info.raw_vecsize = decl.vecsize;
		var.var_id = create_bindless_heap_variable(info);
		decls.push_back(var);
	}

	return decls;
}